

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

uint __thiscall crnlib::symbol_codec::decode(symbol_codec *this,adaptive_arith_data_model *model)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 1;
  do {
    uVar1 = decode(this,(model->m_probs).m_p + uVar3,true);
    uVar2 = uVar1 + (int)uVar3 * 2;
    uVar3 = (ulong)uVar2;
  } while (uVar2 < model->m_total_syms);
  return uVar2 - model->m_total_syms;
}

Assistant:

uint symbol_codec::decode(adaptive_arith_data_model& model) {
  uint node = 1;

  do {
    uint bit = decode(model.m_probs[node]);

    node = (node << 1) + bit;

  } while (node < model.m_total_syms);

  return node - model.m_total_syms;
}